

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O2

bool google::protobuf::util::FieldMaskUtil::SnakeCaseToCamelCase(StringPiece input,string *output)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  int i;
  long i_00;
  undefined1 local_38 [8];
  StringPiece input_local;
  
  input_local.ptr_ = (char *)input.length_;
  local_38 = (undefined1  [8])input.ptr_;
  output->_M_string_length = 0;
  *(output->_M_dataplus)._M_p = '\0';
  i_00 = 0;
  bVar3 = false;
  do {
    if ((long)input_local.ptr_ <= i_00) {
      return (bool)(bVar3 ^ 1);
    }
    cVar2 = StringPiece::operator[]((StringPiece *)local_38,i_00);
    if (('@' < cVar2) &&
       (cVar2 = StringPiece::operator[]((StringPiece *)local_38,i_00), cVar2 < '[')) {
      return false;
    }
    cVar2 = StringPiece::operator[]((StringPiece *)local_38,i_00);
    if (bVar3) {
      if (cVar2 < 'a') {
        return false;
      }
      cVar2 = StringPiece::operator[]((StringPiece *)local_38,i_00);
      if ('z' < cVar2) {
        return false;
      }
      StringPiece::operator[]((StringPiece *)local_38,i_00);
      bVar3 = false;
LAB_00321846:
      std::__cxx11::string::push_back((char)output);
      bVar1 = bVar3;
    }
    else {
      bVar1 = true;
      if (cVar2 != '_') {
        StringPiece::operator[]((StringPiece *)local_38,i_00);
        goto LAB_00321846;
      }
    }
    bVar3 = bVar1;
    i_00 = i_00 + 1;
  } while( true );
}

Assistant:

bool FieldMaskUtil::SnakeCaseToCamelCase(StringPiece input,
                                         std::string* output) {
  output->clear();
  bool after_underscore = false;
  for (int i = 0; i < input.size(); ++i) {
    if (input[i] >= 'A' && input[i] <= 'Z') {
      // The field name must not contain uppercase letters.
      return false;
    }
    if (after_underscore) {
      if (input[i] >= 'a' && input[i] <= 'z') {
        output->push_back(input[i] + 'A' - 'a');
        after_underscore = false;
      } else {
        // The character after a "_" must be a lowercase letter.
        return false;
      }
    } else if (input[i] == '_') {
      after_underscore = true;
    } else {
      output->push_back(input[i]);
    }
  }
  if (after_underscore) {
    // Trailing "_".
    return false;
  }
  return true;
}